

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

void __thiscall tcu::TextureCube::TextureCube(TextureCube *this,TextureFormat *format,int size)

{
  TextureCubeView *this_00;
  uint uVar1;
  uint uVar2;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *this_01;
  int face;
  long lVar3;
  ConstPixelBufferAccess *levels [6];
  TextureCubeView local_60;
  
  this->m_format = *format;
  this->m_size = size;
  this_00 = &this->m_view;
  memset(this->m_data,0,0x120);
  TextureCubeView::TextureCubeView(this_00);
  uVar1 = this->m_size;
  uVar2 = 0x20;
  if (uVar1 != 0) {
    uVar2 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  this_01 = this->m_access;
  uVar2 = 0x20 - uVar2;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    std::
    vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ::resize((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
              *)(this_01 + -6),(ulong)uVar2);
    std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
              (this_01,(ulong)uVar2);
    levels[lVar3] =
         &((this_01->
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>).
           _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess;
    this_01 = this_01 + 1;
  }
  TextureCubeView::TextureCubeView(&local_60,uVar2,&levels);
  (this->m_view).m_levels[5] = local_60.m_levels[5];
  (this->m_view).m_levels[3] = local_60.m_levels[3];
  (this->m_view).m_levels[4] = local_60.m_levels[4];
  (this->m_view).m_levels[1] = local_60.m_levels[1];
  (this->m_view).m_levels[2] = local_60.m_levels[2];
  this_00->m_numLevels = local_60.m_numLevels;
  *(undefined4 *)&this_00->field_0x4 = local_60._4_4_;
  (this->m_view).m_levels[0] = local_60.m_levels[0];
  return;
}

Assistant:

TextureCube::TextureCube (const TextureFormat& format, int size)
	: m_format	(format)
	, m_size	(size)
{
	const int						numLevels		= computeMipPyramidLevels(m_size);
	const ConstPixelBufferAccess*	levels[CUBEFACE_LAST];

	for (int face = 0; face < CUBEFACE_LAST; face++)
	{
		m_data[face].resize(numLevels);
		m_access[face].resize(numLevels);
		levels[face] = &m_access[face][0];
	}

	m_view = TextureCubeView(numLevels, levels);
}